

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O0

void __thiscall
glcts::GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest::
deinit(GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest
       *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest
  *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->to_id_2d != 0) {
    (**(code **)(lVar3 + 0xb8))(0x9100,0);
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d);
  }
  if (this->to_id_2d_array != 0) {
    (**(code **)(lVar3 + 0xb8))(0x9102,0);
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d_array);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (to_id_2d != 0)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
		gl.deleteTextures(1, &to_id_2d);
	}

	if (to_id_2d_array != 0)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 0);
		gl.deleteTextures(1, &to_id_2d_array);
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}